

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

string * __thiscall cppnet::Address::ToIpv4(string *__return_storage_ptr__,Address *this,string *ip)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  
  lVar3 = std::__cxx11::string::find((char)ip,0x3a);
  if (lVar3 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (ip->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + ip->_M_string_length);
  }
  else {
    lVar3 = std::__cxx11::string::rfind((char)ip,0x3a);
    pcVar1 = (ip->_M_dataplus)._M_p;
    sVar2 = ip->_M_string_length;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1 + lVar3,pcVar1 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToIpv4(const std::string& ip) {
    if (IsIpv4(ip)) {
        return ip;
    }
    std::size_t pos = ip.rfind(':');

    return std::string(&ip[pos], ip.length() - pos);
}